

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_inplace_union(array_container_t *src_1,run_container_t *src_2)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int min;
  rle16_t *prVar4;
  rle16_t local_38;
  int32_t local_34;
  rle16_t previousrle;
  int src2nruns;
  int32_t arraypos;
  int32_t rlepos;
  rle16_t *inputsrc2;
  int32_t neededcapacity;
  int32_t maxoutput;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_2);
  if (!_Var2) {
    iVar3 = src_1->cardinality + src_2->n_runs;
    min = iVar3 + src_2->n_runs;
    if (src_2->capacity < min) {
      run_container_grow(src_2,min,true);
    }
    memmove(src_2->runs + iVar3,src_2->runs,(long)src_2->n_runs << 2);
    prVar4 = src_2->runs + iVar3;
    previousrle.value = 0;
    previousrle.length = 0;
    local_34 = src_2->n_runs;
    src_2->n_runs = 0;
    bVar1 = *src_1->array < prVar4->value;
    if (bVar1) {
      local_38 = run_container_append_value_first(src_2,*src_1->array);
      previousrle = (rle16_t)((int)previousrle + 1);
    }
    else {
      local_38 = run_container_append_first(src_2,*prVar4);
    }
    src2nruns = (int)!bVar1;
    while( true ) {
      bVar1 = false;
      if (src2nruns < local_34) {
        bVar1 = (int)previousrle < src_1->cardinality;
      }
      if (!bVar1) break;
      if (src_1->array[(int)previousrle] < prVar4[src2nruns].value) {
        run_container_append_value(src_2,src_1->array[(int)previousrle],&local_38);
        previousrle = (rle16_t)((int)previousrle + 1);
      }
      else {
        run_container_append(src_2,prVar4[src2nruns],&local_38);
        src2nruns = src2nruns + 1;
      }
    }
    if ((int)previousrle < src_1->cardinality) {
      for (; (int)previousrle < src_1->cardinality; previousrle = (rle16_t)((int)previousrle + 1)) {
        run_container_append_value(src_2,src_1->array[(int)previousrle],&local_38);
      }
    }
    else {
      for (; src2nruns < local_34; src2nruns = src2nruns + 1) {
        run_container_append(src_2,prVar4[src2nruns],&local_38);
      }
    }
  }
  return;
}

Assistant:

void array_run_container_inplace_union(const array_container_t *src_1,
                                       run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return;
    }
    const int32_t maxoutput = src_1->cardinality + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_2->n_runs;
    if (src_2->capacity < neededcapacity)
        run_container_grow(src_2, neededcapacity, true);
    memmove(src_2->runs + maxoutput, src_2->runs,
            src_2->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc2 = src_2->runs + maxoutput;
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    int src2nruns = src_2->n_runs;
    src_2->n_runs = 0;

    rle16_t previousrle;

    if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(src_2, inputsrc2[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(src_2, src_1->array[arraypos]);
        arraypos++;
    }

    while ((rlepos < src2nruns) && (arraypos < src_1->cardinality)) {
        if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src2nruns) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        }
    }
}